

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayout::setCorner(QMainWindowLayout *this,Corner corner,DockWidgetArea area)

{
  bool bVar1;
  int in_EDX;
  uint in_ESI;
  long *in_RDI;
  
  if (*(int *)((long)in_RDI + (ulong)in_ESI * 4 + 0x1a0) != in_EDX) {
    *(int *)((long)in_RDI + (ulong)in_ESI * 4 + 0x1a0) = in_EDX;
    bVar1 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f6610);
    if (bVar1) {
      *(int *)((long)in_RDI + (ulong)in_ESI * 4 + 0x4d8) = in_EDX;
    }
    (**(code **)(*in_RDI + 0x70))();
  }
  return;
}

Assistant:

void QMainWindowLayout::setCorner(Qt::Corner corner, Qt::DockWidgetArea area)
{
    if (layoutState.dockAreaLayout.corners[corner] == area)
        return;
    layoutState.dockAreaLayout.corners[corner] = area;
    if (savedState.isValid())
        savedState.dockAreaLayout.corners[corner] = area;
    invalidate();
}